

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SamplerTest.cpp
# Opt level: O1

void __thiscall
jaegertracing::samplers::Sampler_testRemotelyControlledSampler_Test::TestBody
          (Sampler_testRemotelyControlledSampler_Test *this)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  bool bVar2;
  char cVar3;
  int iVar4;
  uint uVar5;
  long *plVar6;
  int *piVar7;
  long lVar8;
  long lVar9;
  result_type_conflict rVar10;
  pointer *ppTVar11;
  ulong uVar12;
  AssertionResult gtest_ar_;
  undefined8 local_1f70;
  undefined1 local_1f68 [16];
  pointer local_1f58;
  long lStack_1f50;
  unique_ptr<jaegertracing::logging::Logger,_std::default_delete<jaegertracing::logging::Logger>_>
  logger;
  unique_ptr<jaegertracing::metrics::Metrics,_std::default_delete<jaegertracing::metrics::Metrics>_>
  metrics;
  string local_1f38;
  TraceID traceID;
  shared_ptr<jaegertracing::testutils::MockAgent> mockAgent;
  ProbabilisticSamplingStrategy probaStrategy;
  SamplingStrategyResponse config;
  RemotelyControlledSampler sampler;
  mt19937_64 rng;
  random_device device;
  
  testutils::MockAgent::make();
  jaegertracing::testutils::MockAgent::start();
  jaegertracing::logging::nullLogger();
  jaegertracing::metrics::Metrics::makeNullMetrics();
  _config = std::istream::_M_extract<long>;
  jaegertracing::sampling_manager::thrift::SamplingStrategyResponse::__set_strategyType
            ((type)&config);
  _probaStrategy = std::runtime_error::runtime_error;
  jaegertracing::sampling_manager::thrift::ProbabilisticSamplingStrategy::__set_samplingRate(1.0);
  jaegertracing::sampling_manager::thrift::SamplingStrategyResponse::__set_probabilisticSampling
            ((ProbabilisticSamplingStrategy *)&config);
  testutils::MockAgent::
  addSamplingStrategy<char_const(&)[13],jaegertracing::sampling_manager::thrift::SamplingStrategyResponse&>
            (mockAgent.
             super___shared_ptr<jaegertracing::testutils::MockAgent,_(__gnu_cxx::_Lock_policy)2>.
             _M_ptr,(char (*) [13])"test-service",&config);
  rng._M_x[0] = (unsigned_long)(rng._M_x + 2);
  std::__cxx11::string::_M_construct<char_const*>((string *)&rng,"test-service","");
  memcpy((IPAddress *)&device,
         mockAgent.
         super___shared_ptr<jaegertracing::testutils::MockAgent,_(__gnu_cxx::_Lock_policy)2>._M_ptr
         + 0x240,0x88);
  net::IPAddress::authority_abi_cxx11_(&local_1f38,(IPAddress *)&device);
  plVar6 = (long *)std::__cxx11::string::replace((ulong)&local_1f38,0,(char *)0x0,0x1e08bf);
  local_1f68._0_8_ = &local_1f58;
  ppTVar11 = (pointer *)(plVar6 + 2);
  if ((pointer *)*plVar6 == ppTVar11) {
    local_1f58 = *ppTVar11;
    lStack_1f50 = plVar6[3];
  }
  else {
    local_1f58 = *ppTVar11;
    local_1f68._0_8_ = (pointer *)*plVar6;
  }
  local_1f68._8_8_ = plVar6[1];
  *plVar6 = (long)ppTVar11;
  plVar6[1] = 0;
  *(undefined1 *)(plVar6 + 2) = 0;
  gtest_ar_.success_ = false;
  gtest_ar_._1_7_ = 0;
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::
  __shared_count<jaegertracing::samplers::ProbabilisticSampler,std::allocator<jaegertracing::samplers::ProbabilisticSampler>,double_const&>
            ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)&gtest_ar_.message_,
             (ProbabilisticSampler **)&gtest_ar_,
             (allocator<jaegertracing::samplers::ProbabilisticSampler> *)&local_1f70,
             (double *)&(anonymous_namespace)::kTestDefaultSamplingProbability);
  traceID._high = gtest_ar_._0_8_;
  traceID._low = (uint64_t)gtest_ar_.message_.ptr_;
  gtest_ar_.success_ = false;
  gtest_ar_._1_7_ = 0;
  gtest_ar_.message_.ptr_ = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0
  ;
  local_1f70 = 100000000;
  jaegertracing::samplers::RemotelyControlledSampler::RemotelyControlledSampler
            (&sampler,(string *)&rng,(string *)local_1f68,(shared_ptr *)&traceID,10,
             (duration *)&local_1f70,
             (Logger *)
             logger._M_t.
             super___uniq_ptr_impl<jaegertracing::logging::Logger,_std::default_delete<jaegertracing::logging::Logger>_>
             ._M_t.
             super__Tuple_impl<0UL,_jaegertracing::logging::Logger_*,_std::default_delete<jaegertracing::logging::Logger>_>
             .super__Head_base<0UL,_jaegertracing::logging::Logger_*,_false>._M_head_impl,
             (Metrics *)
             metrics._M_t.
             super___uniq_ptr_impl<jaegertracing::metrics::Metrics,_std::default_delete<jaegertracing::metrics::Metrics>_>
             ._M_t.
             super__Tuple_impl<0UL,_jaegertracing::metrics::Metrics_*,_std::default_delete<jaegertracing::metrics::Metrics>_>
             .super__Head_base<0UL,_jaegertracing::metrics::Metrics_*,_false>._M_head_impl);
  if (traceID._low != 0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)traceID._low);
  }
  if (gtest_ar_.message_.ptr_ !=
      (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)gtest_ar_.message_.ptr_);
  }
  if ((pointer *)local_1f68._0_8_ != &local_1f58) {
    operator_delete((void *)local_1f68._0_8_);
  }
  paVar1 = &local_1f38.field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1f38._M_dataplus._M_p != paVar1) {
    operator_delete(local_1f38._M_dataplus._M_p);
  }
  if ((unsigned_long *)rng._M_x[0] != rng._M_x + 2) {
    operator_delete((void *)rng._M_x[0]);
  }
  device.field_0.field_0._M_file = (void *)0x0;
  device.field_0.field_0._M_func = (_func_result_type_void_ptr *)0x5f5e100;
  do {
    iVar4 = nanosleep((timespec *)&device,(timespec *)&device);
    if (iVar4 != -1) break;
    piVar7 = __errno_location();
  } while (*piVar7 == 4);
  std::random_device::random_device(&device);
  rng._M_x[0] = 0x1571;
  lVar8 = 1;
  uVar12 = 0x1571;
  do {
    uVar12 = (uVar12 >> 0x3e ^ uVar12) * 0x5851f42d4c957f2d + lVar8;
    rng._M_x[lVar8] = uVar12;
    lVar8 = lVar8 + 1;
  } while (lVar8 != 0x138);
  rng._M_p = 0x138;
  uVar5 = std::random_device::_M_getval();
  rng._M_x[0] = (unsigned_long)uVar5;
  lVar8 = 1;
  uVar12 = rng._M_x[0];
  do {
    uVar12 = (uVar12 >> 0x3e ^ uVar12) * 0x5851f42d4c957f2d + lVar8;
    rng._M_x[lVar8] = uVar12;
    lVar8 = lVar8 + 1;
  } while (lVar8 != 0x138);
  rng._M_p = 0x138;
  lVar8 = std::chrono::_V2::steady_clock::now();
  while( true ) {
    lVar9 = std::chrono::_V2::steady_clock::now();
    if (999999999 < lVar9 - lVar8) {
      jaegertracing::samplers::RemotelyControlledSampler::close();
      goto LAB_001c16d8;
    }
    rVar10 = std::
             mersenne_twister_engine<unsigned_long,_64UL,_312UL,_156UL,_31UL,_13043109905998158313UL,_29UL,_6148914691236517205UL,_17UL,_8202884508482404352UL,_37UL,_18444473444759240704UL,_43UL,_6364136223846793005UL>
             ::operator()(&rng);
    traceID._low = std::
                   mersenne_twister_engine<unsigned_long,_64UL,_312UL,_156UL,_31UL,_13043109905998158313UL,_29UL,_6148914691236517205UL,_17UL,_8202884508482404352UL,_37UL,_18444473444759240704UL,_43UL,_6364136223846793005UL>
                   ::operator()(&rng);
    local_1f38._M_dataplus._M_p = (pointer)paVar1;
    traceID._high = rVar10;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_1f38,"op","");
    jaegertracing::samplers::RemotelyControlledSampler::isSampled
              ((TraceID *)local_1f68,(string *)&sampler);
    gtest_ar_.success_ = (bool)local_1f68[0];
    gtest_ar_.message_.ptr_ =
         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
    std::vector<jaegertracing::Tag,_std::allocator<jaegertracing::Tag>_>::~vector
              ((vector<jaegertracing::Tag,_std::allocator<jaegertracing::Tag>_> *)(local_1f68 + 8));
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_1f38._M_dataplus._M_p != paVar1) {
      operator_delete(local_1f38._M_dataplus._M_p);
    }
    bVar2 = gtest_ar_.success_;
    if (gtest_ar_.success_ == false) break;
    testing::internal::
    scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
    reset(&gtest_ar_.message_,
          (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
    local_1f68._0_8_ = (pointer *)0x0;
    local_1f68._8_8_ =
         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x1312d00;
    do {
      iVar4 = nanosleep((timespec *)local_1f68,(timespec *)local_1f68);
      if (iVar4 != -1) break;
      piVar7 = __errno_location();
    } while (*piVar7 == 4);
    if (bVar2 == false) {
LAB_001c16d8:
      std::random_device::_M_fini();
      RemotelyControlledSampler::~RemotelyControlledSampler(&sampler);
      jaegertracing::sampling_manager::thrift::ProbabilisticSamplingStrategy::
      ~ProbabilisticSamplingStrategy(&probaStrategy);
      jaegertracing::sampling_manager::thrift::SamplingStrategyResponse::~SamplingStrategyResponse
                (&config);
      if ((__uniq_ptr_impl<jaegertracing::metrics::Metrics,_std::default_delete<jaegertracing::metrics::Metrics>_>
           )metrics._M_t.
            super___uniq_ptr_impl<jaegertracing::metrics::Metrics,_std::default_delete<jaegertracing::metrics::Metrics>_>
            ._M_t.
            super__Tuple_impl<0UL,_jaegertracing::metrics::Metrics_*,_std::default_delete<jaegertracing::metrics::Metrics>_>
            .super__Head_base<0UL,_jaegertracing::metrics::Metrics_*,_false>._M_head_impl !=
          (__uniq_ptr_impl<jaegertracing::metrics::Metrics,_std::default_delete<jaegertracing::metrics::Metrics>_>
           )0x0) {
        jaegertracing::metrics::Metrics::~Metrics
                  ((Metrics *)
                   metrics._M_t.
                   super___uniq_ptr_impl<jaegertracing::metrics::Metrics,_std::default_delete<jaegertracing::metrics::Metrics>_>
                   ._M_t.
                   super__Tuple_impl<0UL,_jaegertracing::metrics::Metrics_*,_std::default_delete<jaegertracing::metrics::Metrics>_>
                   .super__Head_base<0UL,_jaegertracing::metrics::Metrics_*,_false>._M_head_impl);
        operator_delete((void *)metrics._M_t.
                                super___uniq_ptr_impl<jaegertracing::metrics::Metrics,_std::default_delete<jaegertracing::metrics::Metrics>_>
                                ._M_t.
                                super__Tuple_impl<0UL,_jaegertracing::metrics::Metrics_*,_std::default_delete<jaegertracing::metrics::Metrics>_>
                                .super__Head_base<0UL,_jaegertracing::metrics::Metrics_*,_false>.
                                _M_head_impl);
      }
      if ((__uniq_ptr_impl<jaegertracing::logging::Logger,_std::default_delete<jaegertracing::logging::Logger>_>
           )logger._M_t.
            super___uniq_ptr_impl<jaegertracing::logging::Logger,_std::default_delete<jaegertracing::logging::Logger>_>
            ._M_t.
            super__Tuple_impl<0UL,_jaegertracing::logging::Logger_*,_std::default_delete<jaegertracing::logging::Logger>_>
            .super__Head_base<0UL,_jaegertracing::logging::Logger_*,_false>._M_head_impl !=
          (__uniq_ptr_impl<jaegertracing::logging::Logger,_std::default_delete<jaegertracing::logging::Logger>_>
           )0x0) {
        (**(code **)(*(long *)logger._M_t.
                              super___uniq_ptr_impl<jaegertracing::logging::Logger,_std::default_delete<jaegertracing::logging::Logger>_>
                              ._M_t.
                              super__Tuple_impl<0UL,_jaegertracing::logging::Logger_*,_std::default_delete<jaegertracing::logging::Logger>_>
                              .super__Head_base<0UL,_jaegertracing::logging::Logger_*,_false>.
                              _M_head_impl + 8))();
      }
      if (mockAgent.
          super___shared_ptr<jaegertracing::testutils::MockAgent,_(__gnu_cxx::_Lock_policy)2>.
          _M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                  (mockAgent.
                   super___shared_ptr<jaegertracing::testutils::MockAgent,_(__gnu_cxx::_Lock_policy)2>
                   ._M_refcount._M_pi);
      }
      return;
    }
  }
  testing::Message::Message((Message *)&local_1f38);
  testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
            ((AssertionResult *)local_1f68,&gtest_ar_.success_,
             "sampler.isSampled(traceID, kTestOperationName).isSampled()","false");
  testing::internal::AssertHelper::AssertHelper
            ((AssertHelper *)&local_1f70,kFatalFailure,
             "/workspace/llm4binary/github/license_all_cmakelists_1510/grimmmyshini[P]jaeger-cpp-example/src/jaegertracing/samplers/SamplerTest.cpp"
             ,0x16d,(char *)local_1f68._0_8_);
  testing::internal::AssertHelper::operator=((AssertHelper *)&local_1f70,(Message *)&local_1f38);
  testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_1f70);
  if ((pointer *)local_1f68._0_8_ != &local_1f58) {
    operator_delete((void *)local_1f68._0_8_);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1f38._M_dataplus._M_p !=
      (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)0x0) {
    cVar3 = testing::internal::IsTrue(true);
    if ((cVar3 != '\0') &&
       ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_1f38._M_dataplus._M_p !=
        (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)0x0)) {
      (**(code **)(*(size_type *)local_1f38._M_dataplus._M_p + 8))();
    }
    local_1f38._M_dataplus._M_p = (pointer)0x0;
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  reset(&gtest_ar_.message_,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0
       );
  goto LAB_001c16d8;
}

Assistant:

TEST(Sampler, testRemotelyControlledSampler)
{
    const auto mockAgent = testutils::MockAgent::make();
    mockAgent->start();
    const auto logger = logging::nullLogger();
    const auto metrics = metrics::Metrics::makeNullMetrics();
            
    // Make sure remote sampling probability is 1
    sampling_manager::thrift::SamplingStrategyResponse config;
    config.__set_strategyType(
        sampling_manager::thrift::SamplingStrategyType::PROBABILISTIC);
    sampling_manager::thrift::ProbabilisticSamplingStrategy probaStrategy;
    probaStrategy.__set_samplingRate(1.0);
    config.__set_probabilisticSampling(probaStrategy);
    mockAgent->addSamplingStrategy("test-service", config);

    // Default probability of 0.5, switches to 1 when downloaded
    RemotelyControlledSampler sampler(
        "test-service",
        "http://" + mockAgent->samplingServerAddress().authority(),
        std::make_shared<ProbabilisticSampler>(kTestDefaultSamplingProbability),
        kTestDefaultMaxOperations,
        std::chrono::milliseconds(100),
        *logger,
        *metrics);
    
    // Wait a bit for remote config download to be done
    std::this_thread::sleep_for(std::chrono::milliseconds(100));
    std::random_device device;
    std::mt19937_64 rng;
    rng.seed(device());
    for (auto startTime = RemotelyControlledSampler::Clock::now();
         std::chrono::duration_cast<std::chrono::seconds>(
             RemotelyControlledSampler::Clock::now() - startTime)
             .count() < 1;) {
        TraceID traceID(rng(), rng());
        // If probability was 0.5 we could reasonnably assume one of 50 samples fail
        ASSERT_TRUE(sampler.isSampled(traceID, kTestOperationName).isSampled());
        std::this_thread::sleep_for(std::chrono::milliseconds(20));
    }
    sampler.close();
}